

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::ScanLineInputFile::rawPixelDataToBuffer
          (ScanLineInputFile *this,int scanLine,char *pixelData,int *pixelDataSize)

{
  Data *ifd;
  ArgExc *pAVar1;
  char *pixelData_local;
  stringstream _iex_replace_s;
  
  pixelData_local = pixelData;
  if (this->_data->memoryMapped == true) {
    pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (pAVar1,
               "Reading raw pixel data to a buffer is not supported for memory mapped streams.");
    __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  __iex_replace_s = this->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  ifd = this->_data;
  if ((ifd->minY <= scanLine) && (scanLine <= ifd->maxY)) {
    anon_unknown_7::readPixelData(this->_streamData,ifd,scanLine,&pixelData_local,pixelDataSize);
    IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
    return;
  }
  pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar1,"Tried to read scan line outside the image file\'s data window.");
  __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void ScanLineInputFile::rawPixelDataToBuffer(int scanLine,
                                             char *pixelData,
                                             int &pixelDataSize) const
{
  if (_data->memoryMapped) {
    throw IEX_NAMESPACE::ArgExc ("Reading raw pixel data to a buffer "
                                 "is not supported for memory mapped "
                                 "streams." );
  }

  try 
  {
    Lock lock (*_streamData);
    
    if (scanLine < _data->minY || scanLine > _data->maxY) 
    {
      throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
                                   "the image file's data window.");
    }
    
    readPixelData
      (_streamData, _data, scanLine, pixelData, pixelDataSize);
    
  }
  catch (IEX_NAMESPACE::BaseExc &e) 
  {
    REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
    throw;
  }
}